

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_functionAnalysisEnvironment_create
          (sysbvm_context_t *context,sysbvm_tuple_t parent,sysbvm_tuple_t functionDefinition)

{
  sysbvm_object_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_functionAnalysisEnvironment_t *result;
  sysbvm_tuple_t functionDefinition_local;
  sysbvm_tuple_t parent_local;
  sysbvm_context_t *context_local;
  
  psVar1 = sysbvm_context_allocatePointerTuple
                     (context,(context->roots).functionAnalysisEnvironmentType,0x19);
  psVar1[2].header.field_0.typePointer = parent;
  psVar1[5].field_1.pointers[0] = functionDefinition;
  sVar2 = sysbvm_identityDictionary_create(context);
  psVar1[6].header.field_0.typePointer = sVar2;
  sVar2 = sysbvm_orderedCollection_create(context);
  psVar1[6].header.identityHashAndFlags = (int)sVar2;
  psVar1[6].header.objectSize = (int)(sVar2 >> 0x20);
  sVar2 = sysbvm_orderedCollection_create(context);
  psVar1[6].field_1.pointers[0] = sVar2;
  sVar2 = sysbvm_orderedCollection_create(context);
  psVar1[7].header.field_0.typePointer = sVar2;
  sVar2 = sysbvm_orderedCollection_create(context);
  psVar1[7].field_1.pointers[0] = sVar2;
  sVar2 = sysbvm_orderedCollection_create(context);
  psVar1[7].header.identityHashAndFlags = (int)sVar2;
  psVar1[7].header.objectSize = (int)(sVar2 >> 0x20);
  psVar1[8].header.identityHashAndFlags = 0xf;
  psVar1[8].header.objectSize = 0;
  psVar1[5].header.field_0.typePointer = 0xf;
  psVar1[5].header.identityHashAndFlags = 0xf;
  psVar1[5].header.objectSize = 0;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionAnalysisEnvironment_create(sysbvm_context_t *context, sysbvm_tuple_t parent, sysbvm_tuple_t functionDefinition)
{
    sysbvm_functionAnalysisEnvironment_t *result = (sysbvm_functionAnalysisEnvironment_t*)sysbvm_context_allocatePointerTuple(context, context->roots.functionAnalysisEnvironmentType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_functionAnalysisEnvironment_t));
    result->super.super.super.parent = parent;
    result->functionDefinition = functionDefinition;
    result->captureBindingTable = sysbvm_identityDictionary_create(context);
    result->captureBindingList = sysbvm_orderedCollection_create(context);
    result->argumentBindingList = sysbvm_orderedCollection_create(context);
    result->localBindingList = sysbvm_orderedCollection_create(context);
    result->innerFunctionList = sysbvm_orderedCollection_create(context);
    result->pragmaList = sysbvm_orderedCollection_create(context);
    result->keepSourceDefinition = SYSBVM_FALSE_TUPLE;
    result->super.hasBreakTarget = SYSBVM_FALSE_TUPLE;
    result->super.hasContinueTarget = SYSBVM_FALSE_TUPLE;
    return (sysbvm_tuple_t)result;
}